

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall TiXmlDeclaration::CopyTo(TiXmlDeclaration *this,TiXmlDeclaration *target)

{
  TiXmlNode::CopyTo(&this->super_TiXmlNode,&target->super_TiXmlNode);
  TiXmlString::operator=(&target->version,&this->version);
  TiXmlString::operator=(&target->encoding,&this->encoding);
  TiXmlString::operator=(&target->standalone,&this->standalone);
  return;
}

Assistant:

void TiXmlDeclaration::CopyTo( TiXmlDeclaration* target ) const
{
	TiXmlNode::CopyTo( target );

	target->version = version;
	target->encoding = encoding;
	target->standalone = standalone;
}